

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OutputOptions.cpp
# Opt level: O1

bool __thiscall nvtt::OutputOptions::Private::openFile(Private *this)

{
  char *name;
  int iVar1;
  OutputHandler *pOVar2;
  bool bVar3;
  
  bVar3 = true;
  if ((this->fileName).super_StringBuilder.m_size != 0) {
    if ((this->outputHandler != (OutputHandler *)0x0) &&
       (iVar1 = nvAbort("outputHandler == __null",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvtt/OutputOptions.cpp"
                        ,0x50,"bool nvtt::OutputOptions::Private::openFile() const"), iVar1 == 1)) {
      raise(5);
    }
    pOVar2 = (OutputHandler *)operator_new(0x28);
    name = (this->fileName).super_StringBuilder.m_str;
    pOVar2->_vptr_OutputHandler = (_func_int **)&PTR__DefaultOutputHandler_0024daf8;
    nv::StdOutputStream::StdOutputStream((StdOutputStream *)(pOVar2 + 1),name);
    if (((FILE *)pOVar2[3]._vptr_OutputHandler != (FILE *)0x0) &&
       (iVar1 = ferror((FILE *)pOVar2[3]._vptr_OutputHandler), iVar1 == 0)) {
      this->outputHandler = pOVar2;
      return true;
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool OutputOptions::Private::openFile() const
{
	if (!fileName.isNull())
	{
		nvCheck(outputHandler == NULL);
		
		DefaultOutputHandler * oh = new DefaultOutputHandler(fileName.str());
		if (oh->stream.isError())
		{
			return false;
		}
		
		outputHandler = oh;
	}
	
	return true;
}